

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O2

TIfStackEntry __thiscall tcpp::Preprocessor::_processIfndefConditional(Preprocessor *this)

{
  pointer pTVar1;
  __type _Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  pointer __lhs;
  pointer pTVar6;
  bool bVar7;
  TToken currToken;
  string macroIdentifier;
  undefined1 local_68 [56];
  
  Lexer::GetNextToken(&currToken,this->mpLexer);
  local_68._0_4_ = SPACE;
  _expect(this,(E_TOKEN_TYPE *)local_68,&currToken.mType);
  Lexer::GetNextToken((TToken *)local_68,this->mpLexer);
  TToken::operator=(&currToken,(TToken *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  local_68._0_4_ = IDENTIFIER;
  _expect(this,(E_TOKEN_TYPE *)local_68,&currToken.mType);
  std::__cxx11::string::string((string *)&macroIdentifier,(string *)&currToken.mRawView);
  do {
    Lexer::GetNextToken((TToken *)local_68,this->mpLexer);
    TToken::operator=(&currToken,(TToken *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 8));
  } while (currToken.mType == SPACE);
  local_68._0_4_ = NEWLINE;
  _expect(this,(E_TOKEN_TYPE *)local_68,&currToken.mType);
  __lhs = (this->mSymTable).super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
          _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->mSymTable).super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pTVar1 - (long)__lhs;
  for (lVar5 = lVar4 / 0x58 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    _Var2 = std::operator==(&__lhs->mName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &macroIdentifier);
    pTVar6 = __lhs;
    if (_Var2) goto LAB_001456a7;
    _Var2 = std::operator==(&__lhs[1].mName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &macroIdentifier);
    pTVar6 = __lhs + 1;
    if (_Var2) goto LAB_001456a7;
    _Var2 = std::operator==(&__lhs[2].mName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &macroIdentifier);
    pTVar6 = __lhs + 2;
    if (_Var2) goto LAB_001456a7;
    _Var2 = std::operator==(&__lhs[3].mName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &macroIdentifier);
    pTVar6 = __lhs + 3;
    if (_Var2) goto LAB_001456a7;
    __lhs = __lhs + 4;
    lVar4 = lVar4 + -0x160;
  }
  lVar4 = lVar4 / 0x58;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pTVar6 = pTVar1;
      if ((lVar4 != 3) ||
         (_Var2 = std::operator==(&__lhs->mName,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&macroIdentifier), pTVar6 = __lhs, _Var2)) goto LAB_001456a7;
      __lhs = __lhs + 1;
    }
    _Var2 = std::operator==(&__lhs->mName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &macroIdentifier);
    pTVar6 = __lhs;
    if (_Var2) goto LAB_001456a7;
    __lhs = __lhs + 1;
  }
  _Var2 = std::operator==(&__lhs->mName,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &macroIdentifier);
  pTVar6 = pTVar1;
  if (_Var2) {
    pTVar6 = __lhs;
  }
LAB_001456a7:
  bVar7 = pTVar6 == (this->mSymTable).
                    super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  bVar3 = IsParentBlockActive(&this->mConditionalBlocksStack);
  std::__cxx11::string::~string((string *)&macroIdentifier);
  std::__cxx11::string::~string((string *)&currToken.mRawView);
  return (TIfStackEntry)((uint)!bVar7 | (uint)bVar7 << 0x10 | (uint)bVar3 << 0x18);
}

Assistant:

Preprocessor::TIfStackEntry Preprocessor::_processIfndefConditional() TCPP_NOEXCEPT
	{
		auto currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::SPACE, currToken.mType);

		currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::IDENTIFIER, currToken.mType);

		std::string macroIdentifier = currToken.mRawView;

		do {
			currToken = mpLexer->GetNextToken();
		} while (currToken.mType == E_TOKEN_TYPE::SPACE);

		_expect(E_TOKEN_TYPE::NEWLINE, currToken.mType);

		bool skip = std::find_if(mSymTable.cbegin(), mSymTable.cend(), [&macroIdentifier](auto&& item)
			{
				return item.mName == macroIdentifier;
			}) != mSymTable.cend();

		// \note IsParentBlockActive is used to inherit disabled state for nested blocks
		return TIfStackEntry(skip, IsParentBlockActive(mConditionalBlocksStack));
	}